

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveNonJSOps.cpp
# Opt level: O3

void __thiscall
wasm::StubUnsupportedJSOpsPass::visitCallIndirect(StubUnsupportedJSOpsPass *this,CallIndirect *curr)

{
  MixedArena *this_00;
  Expression *pEVar1;
  Drop *pDVar2;
  Block *value;
  ulong extraout_RDX;
  Module *pMVar3;
  optional<wasm::Type> type;
  Builder local_70;
  Builder builder;
  Drop *local_58;
  Module *local_50;
  undefined1 auStack_48 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> items;
  
  local_70.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::StubUnsupportedJSOpsPass,_wasm::Visitor<wasm::StubUnsupportedJSOpsPass,_void>_>_>
       ).
       super_PostWalker<wasm::StubUnsupportedJSOpsPass,_wasm::Visitor<wasm::StubUnsupportedJSOpsPass,_void>_>
       .
       super_Walker<wasm::StubUnsupportedJSOpsPass,_wasm::Visitor<wasm::StubUnsupportedJSOpsPass,_void>_>
       .currModule;
  auStack_48 = (undefined1  [8])0x0;
  items.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  items.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  builder.wasm = (Module *)
                 (curr->operands).
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                 usedElements;
  local_50 = local_70.wasm;
  if (builder.wasm != (Module *)0x0) {
    this_00 = &(local_70.wasm)->allocator;
    pMVar3 = (Module *)0x0;
    do {
      if ((Module *)
          (curr->operands).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements <=
          pMVar3) {
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      pEVar1 = (curr->operands).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
               [(long)pMVar3];
      pDVar2 = (Drop *)MixedArena::allocSpace(this_00,0x18,8);
      (pDVar2->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
      (pDVar2->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
      pDVar2->value = pEVar1;
      Drop::finalize(pDVar2);
      local_58 = pDVar2;
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      emplace_back<wasm::Expression*>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_48,
                 (Expression **)&local_58);
      pMVar3 = (Module *)
               ((long)&(pMVar3->exports).
                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
    } while (builder.wasm != pMVar3);
  }
  pEVar1 = curr->target;
  pDVar2 = (Drop *)MixedArena::allocSpace(&local_50->allocator,0x18,8);
  (pDVar2->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
  (pDVar2->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
  pDVar2->value = pEVar1;
  Drop::finalize(pDVar2);
  local_58 = pDVar2;
  std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::emplace_back<wasm::Expression*>
            ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_48,
             (Expression **)&local_58);
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)extraout_RDX;
  value = Builder::
          makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                    (&local_70,
                     (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_48,
                     type);
  stubOut(this,(Expression *)value,
          (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)7>).super_Expression.type.id);
  if (auStack_48 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_48,
                    (long)items.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_48);
  }
  return;
}

Assistant:

void visitCallIndirect(CallIndirect* curr) {
    // Indirect calls of the wrong type trap in wasm, but not in wasm2js. Remove
    // the indirect call, but leave the arguments.
    Builder builder(*getModule());
    std::vector<Expression*> items;
    for (auto* operand : curr->operands) {
      items.push_back(builder.makeDrop(operand));
    }
    items.push_back(builder.makeDrop(curr->target));
    stubOut(builder.makeBlock(items), curr->type);
  }